

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O0

void __thiscall
my_algorithm::SymbolPairChecker::SymbolPairChecker
          (SymbolPairChecker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *symbol_pairs)

{
  Stack<char> local_90;
  string local_68 [32];
  string local_48 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *symbol_pairs_local;
  SymbolPairChecker *this_local;
  
  this->_vptr_SymbolPairChecker = (_func_int **)&PTR__SymbolPairChecker_00116cf0;
  local_18 = symbol_pairs;
  symbol_pairs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::__cxx11::string::string((string *)&this->_open_symbols);
  std::__cxx11::string::string((string *)&this->_close_symbols);
  data_structures::Stack<char>::Stack(&this->_stack);
  this->_cursor = 0;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::operator=((string *)&this->_open_symbols,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::operator=((string *)&this->_close_symbols,local_68);
  std::__cxx11::string::~string(local_68);
  setSymbolPairs(this,local_18);
  data_structures::Stack<char>::Stack(&local_90);
  data_structures::Stack<char>::operator=(&this->_stack,&local_90);
  data_structures::Stack<char>::~Stack(&local_90);
  return;
}

Assistant:

SymbolPairChecker::SymbolPairChecker(const std::vector<std::string>& symbol_pairs) {
        _cursor = 0;
        _open_symbols = std::string();
        _close_symbols = std::string();
        setSymbolPairs(symbol_pairs);
        _stack = data_structures::Stack<char>();
    }